

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.h
# Opt level: O0

char * rapidjson::internal::Prettify(char *buffer,int length,int k,int maxDecimalPlaces)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  undefined1 *in_RDI;
  int i_3;
  int i_2;
  int offset;
  int i_1;
  int i;
  int kk;
  int local_34;
  int local_30;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *local_8;
  
  iVar1 = in_ESI + in_EDX;
  if ((in_EDX < 0) || (0x15 < iVar1)) {
    if ((iVar1 < 1) || (0x15 < iVar1)) {
      if ((iVar1 < -5) || (0 < iVar1)) {
        if (SBORROW4(iVar1,-in_ECX) == iVar1 + in_ECX < 0) {
          if (in_ESI == 1) {
            in_RDI[1] = 0x65;
            local_8 = WriteExponent(in_ECX,(char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                            in_stack_ffffffffffffffd8));
          }
          else {
            memmove(in_RDI + 2,in_RDI + 1,(long)(in_ESI + -1));
            in_RDI[1] = 0x2e;
            in_RDI[in_ESI + 1] = 0x65;
            local_8 = WriteExponent(in_ECX,(char *)CONCAT44(in_stack_ffffffffffffffdc,
                                                            in_stack_ffffffffffffffd8));
          }
        }
        else {
          *in_RDI = 0x30;
          in_RDI[1] = 0x2e;
          in_RDI[2] = 0x30;
          local_8 = in_RDI + 3;
        }
      }
      else {
        iVar2 = 2 - iVar1;
        memmove(in_RDI + iVar2,in_RDI,(long)in_ESI);
        *in_RDI = 0x30;
        in_RDI[1] = 0x2e;
        for (local_30 = 2; local_30 < iVar2; local_30 = local_30 + 1) {
          in_RDI[local_30] = 0x30;
        }
        if (in_ECX < in_ESI - iVar1) {
          for (local_34 = in_ECX + 1; 2 < local_34; local_34 = local_34 + -1) {
            if (in_RDI[local_34] != '0') {
              return in_RDI + (local_34 + 1);
            }
          }
          local_8 = in_RDI + 3;
        }
        else {
          local_8 = in_RDI + (in_ESI + iVar2);
        }
      }
    }
    else {
      memmove(in_RDI + (iVar1 + 1),in_RDI + iVar1,(long)(in_ESI - iVar1));
      in_RDI[iVar1] = 0x2e;
      if (in_EDX + in_ECX < 0) {
        for (iVar2 = iVar1 + in_ECX; iVar1 + 1 < iVar2; iVar2 = iVar2 + -1) {
          if (in_RDI[iVar2] != '0') {
            return in_RDI + (iVar2 + 1);
          }
        }
        local_8 = in_RDI + (iVar1 + 2);
      }
      else {
        local_8 = in_RDI + (in_ESI + 1);
      }
    }
  }
  else {
    for (; in_ESI < iVar1; in_ESI = in_ESI + 1) {
      in_RDI[in_ESI] = 0x30;
    }
    in_RDI[iVar1] = 0x2e;
    in_RDI[iVar1 + 1] = 0x30;
    local_8 = in_RDI + (iVar1 + 2);
  }
  return local_8;
}

Assistant:

inline char* Prettify(char* buffer, int length, int k, int maxDecimalPlaces) {
    const int kk = length + k;  // 10^(kk-1) <= v < 10^kk

    if (0 <= k && kk <= 21) {
        // 1234e7 -> 12340000000
        for (int i = length; i < kk; i++)
            buffer[i] = '0';
        buffer[kk] = '.';
        buffer[kk + 1] = '0';
        return &buffer[kk + 2];
    }
    else if (0 < kk && kk <= 21) {
        // 1234e-2 -> 12.34
        std::memmove(&buffer[kk + 1], &buffer[kk], static_cast<size_t>(length - kk));
        buffer[kk] = '.';
        if (0 > k + maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 1.2345 -> 1.23, 1.102 -> 1.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = kk + maxDecimalPlaces; i > kk + 1; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[kk + 2]; // Reserve one zero
        }
        else
            return &buffer[length + 1];
    }
    else if (-6 < kk && kk <= 0) {
        // 1234e-6 -> 0.001234
        const int offset = 2 - kk;
        std::memmove(&buffer[offset], &buffer[0], static_cast<size_t>(length));
        buffer[0] = '0';
        buffer[1] = '.';
        for (int i = 2; i < offset; i++)
            buffer[i] = '0';
        if (length - kk > maxDecimalPlaces) {
            // When maxDecimalPlaces = 2, 0.123 -> 0.12, 0.102 -> 0.1
            // Remove extra trailing zeros (at least one) after truncation.
            for (int i = maxDecimalPlaces + 1; i > 2; i--)
                if (buffer[i] != '0')
                    return &buffer[i + 1];
            return &buffer[3]; // Reserve one zero
        }
        else
            return &buffer[length + offset];
    }
    else if (kk < -maxDecimalPlaces) {
        // Truncate to zero
        buffer[0] = '0';
        buffer[1] = '.';
        buffer[2] = '0';
        return &buffer[3];
    }
    else if (length == 1) {
        // 1e30
        buffer[1] = 'e';
        return WriteExponent(kk - 1, &buffer[2]);
    }
    else {
        // 1234e30 -> 1.234e33
        std::memmove(&buffer[2], &buffer[1], static_cast<size_t>(length - 1));
        buffer[1] = '.';
        buffer[length + 1] = 'e';
        return WriteExponent(kk - 1, &buffer[0 + length + 2]);
    }
}